

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Stress::anon_unknown_0::BlendingCase::drawTestImage
          (BlendingCase *this,PixelBufferAccess *dst,GLuint uColorLoc,int maxVertexIndex)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  deUint32 extraout_var;
  float *pfVar4;
  float fVar5;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined1 local_58 [2];
  deUint16 indices [3];
  Vec4 color;
  int tri;
  undefined1 local_38 [8];
  Random rnd;
  Functions *gl;
  int maxVertexIndex_local;
  GLuint uColorLoc_local;
  PixelBufferAccess *dst_local;
  BlendingCase *this_local;
  
  pRVar3 = gles2::Context::getRenderContext
                     ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)
  ;
  rnd.m_rnd.z = (*pRVar3->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  de::Random::Random((Random *)local_38,0x7b);
  (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
  (**(code **)(rnd.m_rnd._8_8_ + 0x100))(0x8006);
  (**(code **)(rnd.m_rnd._8_8_ + 0x120))(1);
  for (color.m_data[2] = 0.0; (int)color.m_data[2] < 0x14;
      color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_58);
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_58);
    *pfVar4 = fVar5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_58);
    *pfVar4 = fVar5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_58);
    *pfVar4 = fVar5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_58);
    *pfVar4 = fVar5;
    pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a8);
    pfVar4 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_58);
    (*pcVar1)(uColorLoc,1,pfVar4);
    iVar2 = de::Random::getInt((Random *)local_38,0,maxVertexIndex);
    local_5e = (undefined2)iVar2;
    iVar2 = de::Random::getInt((Random *)local_38,0,maxVertexIndex);
    local_5c = (undefined2)iVar2;
    iVar2 = de::Random::getInt((Random *)local_38,0,maxVertexIndex);
    local_5a = (undefined2)iVar2;
    (**(code **)(rnd.m_rnd._8_8_ + 0x568))(4,3,0x1403,&local_5e);
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x648))();
  pRVar3 = gles2::Context::getRenderContext
                     ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)
  ;
  glu::readPixels(pRVar3,0,0,dst);
  de::Random::~Random((Random *)local_38);
  return;
}

Assistant:

void BlendingCase::drawTestImage (tcu::PixelBufferAccess dst, GLuint uColorLoc, int maxVertexIndex)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	de::Random				rnd	(123);

	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	for (int tri = 0; tri < 20; ++tri)
	{
		tcu::Vec4 color;
		color.x() = rnd.getFloat();
		color.y() = rnd.getFloat();
		color.z() = rnd.getFloat();
		color.w() = rnd.getFloat();
		gl.uniform4fv(uColorLoc, 1, color.getPtr());

		deUint16 indices[3];
		indices[0] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[1] = (deUint16)rnd.getInt(0, maxVertexIndex);
		indices[2] = (deUint16)rnd.getInt(0, maxVertexIndex);

		gl.drawElements(GL_TRIANGLES, 3, GL_UNSIGNED_SHORT, indices);
	}

	gl.finish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst);
}